

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

string * verona::unquote(string *__return_storage_ptr__,string *s)

{
  ulong uVar1;
  char *pcVar2;
  
  uVar1 = s->_M_string_length;
  if (((uVar1 < 2) || (pcVar2 = (s->_M_dataplus)._M_p, *pcVar2 != '\"')) ||
     (pcVar2[uVar1 - 1] != '\"')) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,s);
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s,1,uVar1 - 2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string unquote(const std::string& s)
  {
    return ((s.size() >= 2) && (s[0] == '"') && (s[s.size() - 1] == '"')) ?
      s.substr(1, s.size() - 2) :
      s;
  }